

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O1

void __thiscall
Pl_RunLength::Pl_RunLength(Pl_RunLength *this,char *identifier,Pipeline *next,action_e action)

{
  Members *pMVar1;
  logic_error *this_00;
  pointer *__ptr;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_RunLength_002f1758;
  pMVar1 = (Members *)operator_new(0xb0);
  pMVar1->action = action;
  pMVar1->state = st_top;
  pMVar1->length = 0;
  (pMVar1->out)._M_dataplus._M_p = (pointer)&(pMVar1->out).field_2;
  (pMVar1->out)._M_string_length = 0;
  (pMVar1->out).field_2._M_local_buf[0] = '\0';
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>.
  super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl = pMVar1;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_RunLength with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_RunLength::Pl_RunLength(char const* identifier, Pipeline* next, action_e action) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(action))
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_RunLength with nullptr as next");
    }
}